

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::loadArguments(Executor *this,int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  runtime_error *prVar7;
  size_type sVar8;
  uint uVar9;
  long lVar10;
  size_type __n;
  allocator_type local_69;
  Values initial;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar3 = (long)(argc + -1) / 3;
  if ((argc + -1) % 3 != 0) {
    std::operator<<((ostream *)&std::cout,"Wrong arguments.");
    return;
  }
  iVar4 = (int)uVar3;
  __n = (size_type)(uint)-iVar4;
  if (0 < iVar4) {
    __n = uVar3 & 0xffffffff;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__n,&local_69)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_sizes,&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 1; lVar10 - __n != 1; lVar10 = lVar10 + 1) {
    uVar5 = atoi(argv[lVar10]);
    uVar9 = -uVar5;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    puVar1[lVar10 + -1] = uVar9;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__n,&local_69)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_desired,
             &initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  sVar8 = 0;
  while( true ) {
    if (__n == sVar8) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&initial,__n,&local_69);
      puVar2 = initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (int)lVar10 + (int)sVar8;
      sVar8 = 0;
      while( true ) {
        if (__n == sVar8) {
          local_48._M_impl.super__Vector_impl_data._M_start =
               initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          execute(this,(Values *)&local_48);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          return;
        }
        uVar6 = atoi(argv[uVar9]);
        uVar5 = -uVar6;
        if (0 < (int)uVar6) {
          uVar5 = uVar6;
        }
        puVar2[sVar8] = uVar5;
        if (puVar1[sVar8] < uVar5) break;
        uVar9 = uVar9 + 1;
        sVar8 = sVar8 + 1;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Initial value is bigger than units size.");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = atoi(argv[(uint)((int)sVar8 + (int)lVar10)]);
    uVar9 = -uVar5;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    puVar2[sVar8] = uVar9;
    if (puVar1[sVar8] < uVar9) break;
    sVar8 = sVar8 + 1;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Desired value is bigger than units size.");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Executor::loadArguments(int argc, char *argv[])
{
    if ((argc - 1) % 3 != 0)
    {
        std::cout << "Wrong arguments.";
        return;
    }

    unsigned int numberOfUnits = std::abs((argc - 1 ) / 3);

    unsigned int it = 1;

    m_sizes = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_sizes[i] = std::abs(std::atoi(argv[it]));
        ++it;
    }

    m_desired = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_desired[i] = std::abs(std::atoi(argv[it]));
        if (m_desired[i] > m_sizes[i])
            throw std::runtime_error("Desired value is bigger than units size.");
        ++it;
    }

    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        initial[i] = std::abs(std::atoi(argv[it]));
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
        ++it;
    }

    execute(std::move(initial));
}